

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O3

void do_atomic_op_i64(TCGContext_conflict9 *tcg_ctx,TCGv_i64 ret,TCGv_i32 addr,TCGv_i64 val,
                     TCGArg idx,MemOp memop,void **table)

{
  TCGOp *pTVar1;
  TCGTemp *ts;
  TCGTemp *ts_00;
  MemOp opc;
  uintptr_t o_1;
  uintptr_t o;
  TCGTemp *args [1];
  TCGTemp *local_38;
  
  opc = memop & ~MO_BE;
  if ((memop & MO_64) != MO_8) {
    opc = memop;
  }
  if ((~opc & 3) == 0) {
    local_38 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    tcg_gen_callN_tricore(tcg_ctx,helper_exit_atomic_tricore,(TCGTemp *)0x0,1,&local_38);
    pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_movi_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)tcg_ctx);
    pTVar1->args[1] = 0;
  }
  else {
    ts = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    ts_00 = tcg_temp_new_internal_tricore(tcg_ctx,TCG_TYPE_I32,false);
    pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_extrl_i64_i32);
    pTVar1->args[0] = (TCGArg)ts;
    pTVar1->args[1] = (TCGArg)(val + (long)tcg_ctx);
    do_atomic_op_i32(tcg_ctx,(TCGv_i32)((long)ts_00 - (long)tcg_ctx),addr,
                     (TCGv_i32)((long)ts - (long)tcg_ctx),idx,opc & ~MO_ASHIFT,table);
    tcg_temp_free_internal_tricore(tcg_ctx,ts);
    pTVar1 = tcg_emit_op_tricore(tcg_ctx,INDEX_op_extu_i32_i64);
    pTVar1->args[0] = (TCGArg)(ret + (long)&tcg_ctx->pool_cur);
    pTVar1->args[1] = (TCGArg)ts_00;
    tcg_temp_free_internal_tricore(tcg_ctx,ts_00);
    if ((opc & MO_ASHIFT) != MO_8) {
      tcg_gen_ext_i64(tcg_ctx,ret,ret,opc);
      return;
    }
  }
  return;
}

Assistant:

static void do_atomic_op_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv addr, TCGv_i64 val,
                             TCGArg idx, MemOp memop, void * const table[])
{
    memop = tcg_canonicalize_memop(memop, 1, 0);

    if ((memop & MO_SIZE) == MO_64) {
#ifdef CONFIG_ATOMIC64
        gen_atomic_op_i64 gen;

        gen = table[memop & (MO_SIZE | MO_BSWAP)];
        tcg_debug_assert(gen != NULL);

        {
            TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop & ~MO_SIGN, idx));
            gen(tcg_ctx, ret, tcg_ctx->cpu_env, addr, val, oi);
            tcg_temp_free_i32(tcg_ctx, oi);
        }
#else
        gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
        /* Produce a result, so that we have a well-formed opcode stream
           with respect to uses of the result in the (dead) code following.  */
        tcg_gen_movi_i64(tcg_ctx, ret, 0);
#endif /* CONFIG_ATOMIC64 */
    } else {
        TCGv_i32 v32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 r32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, v32, val);
        do_atomic_op_i32(tcg_ctx, r32, addr, v32, idx, memop & ~MO_SIGN, table);
        tcg_temp_free_i32(tcg_ctx, v32);

        tcg_gen_extu_i32_i64(tcg_ctx, ret, r32);
        tcg_temp_free_i32(tcg_ctx, r32);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i64(tcg_ctx, ret, ret, memop);
        }
    }
}